

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerDriver.cpp
# Opt level: O0

bool test_Player_getOwnedCountries(bool verbose)

{
  bool bVar1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar2;
  Hand *this;
  DiceRoller *this_00;
  Player *this_01;
  ostream *poVar3;
  string local_1a0;
  reference local_180;
  Country **i;
  iterator __end2;
  iterator __begin2;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__range2;
  Player *player1;
  DiceRoller *diceRoller;
  Hand *cards;
  Country *pCountry3;
  Country *pCountry2;
  Country *pCountry1;
  string local_128;
  undefined1 local_108 [8];
  Country country3;
  string local_d0;
  undefined1 local_b0 [8];
  Country country2;
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [8];
  Country country1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *ownedCountries1;
  bool success;
  bool verbose_local;
  
  pvVar2 = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)operator_new(0x18);
  (pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::vector(pvVar2);
  country1.pAdjCountries = pvVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"country1",&local_69);
  Map::Country::Country((Country *)local_48,0,&local_68,0);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"country2",(allocator<char> *)((long)&country3.pAdjCountries + 7));
  Map::Country::Country((Country *)local_b0,1,&local_d0,0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&country3.pAdjCountries + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"country3",(allocator<char> *)((long)&pCountry1 + 7));
  Map::Country::Country((Country *)local_108,3,&local_128,1);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)((long)&pCountry1 + 7));
  pCountry2 = (Country *)local_48;
  pCountry3 = (Country *)local_b0;
  cards = (Hand *)local_108;
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::push_back
            (country1.pAdjCountries,&pCountry2);
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::push_back
            (country1.pAdjCountries,&pCountry3);
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::push_back
            (country1.pAdjCountries,(value_type *)&cards);
  this = (Hand *)operator_new(8);
  Hand::Hand(this);
  this_00 = (DiceRoller *)operator_new(0x10);
  DiceRoller::DiceRoller(this_00);
  this_01 = (Player *)operator_new(0x38);
  Player::Player(this_01,country1.pAdjCountries,this,this_00,0);
  pvVar2 = Player::getOwnedCountries(this_01);
  bVar1 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::empty(pvVar2);
  ownedCountries1._6_1_ = !bVar1;
  if (verbose) {
    std::operator<<((ostream *)&std::cout,"\x1b[35m");
    std::operator<<((ostream *)&std::cout,"\nThe player owns countries: ");
    pvVar2 = Player::getOwnedCountries(this_01);
    __end2 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(pvVar2);
    i = (Country **)std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end(pvVar2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                                       *)&i), bVar1) {
      local_180 = __gnu_cxx::
                  __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                  ::operator*(&__end2);
      Map::Country::getCountryName_abi_cxx11_(&local_1a0,*local_180);
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_1a0);
      std::operator<<(poVar3," ");
      std::__cxx11::string::~string((string *)&local_1a0);
      __gnu_cxx::
      __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
      ::operator++(&__end2);
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"\x1b[31m");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  if (this_01 != (Player *)0x0) {
    Player::~Player(this_01);
    operator_delete(this_01,0x38);
  }
  Map::Country::~Country((Country *)local_108);
  Map::Country::~Country((Country *)local_b0);
  Map::Country::~Country((Country *)local_48);
  return ownedCountries1._6_1_;
}

Assistant:

bool test_Player_getOwnedCountries(bool verbose = false) {

    // Arrange
    bool success = true;
    auto* ownedCountries1 = new std::vector<Map::Country*>();
    Map::Country country1 = Map::Country(0, "country1", 0);
    Map::Country country2 = Map::Country(1, "country2", 0);
    Map::Country country3 = Map::Country(3, "country3", 1);
    Map::Country* pCountry1 = &country1;
    Map::Country* pCountry2 = &country2;
    Map::Country* pCountry3 = &country3;
    ownedCountries1->push_back(pCountry1);
    ownedCountries1->push_back(pCountry2);
    ownedCountries1->push_back(pCountry3);
    auto* cards = new Hand();
    auto* diceRoller = new DiceRoller();

    // Act
    auto* player1 = new Player(ownedCountries1, cards, diceRoller, 0);

    // Assert
    if (player1->getOwnedCountries()->empty()) {
        success = false;
    }
    if (verbose) {
        std::cout << "\033[35m";
        std::cout << "\nThe player owns countries: ";
        for (auto& i : *player1->getOwnedCountries()) {
            std::cout << i->getCountryName() << " ";
        }
        std::cout << "\033[31m" << std::endl;
    }
    delete player1;
    return success;
}